

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> * __thiscall
wallet::DescriptorScriptPubKeyMan::GetKeys
          (map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
           *__return_storage_ptr__,DescriptorScriptPubKeyMan *this)

{
  _Rb_tree_header *p_Var1;
  WalletStorage *pWVar2;
  int iVar3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  CKey key;
  CKeyID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if (((char)iVar3 == '\0') ||
     (iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])(),
     (char)iVar3 != '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00974560:
      __stack_chk_fail();
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::_Rb_tree(&__return_storage_ptr__->_M_t,&(this->m_map_keys)._M_t);
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    for (p_Var4 = (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      key.fCompressed = false;
      key.keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
           (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
            )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0;
      pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_88._M_unused._M_object = operator_new(0x18);
      *(_Base_ptr *)local_88._M_unused._0_8_ = p_Var4 + 4;
      *(_Base_ptr **)((long)local_88._M_unused._0_8_ + 8) = &p_Var4[1]._M_right;
      *(CKey **)((long)local_88._M_unused._0_8_ + 0x10) = &key;
      pcStack_70 = std::
                   _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2163:41)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2163:41)>
                 ::_M_manager;
      (*pWVar2->_vptr_WalletStorage[8])(pWVar2,&local_88);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      CPubKey::GetID(&local_4c,(CPubKey *)&p_Var4[1]._M_right);
      this_00 = std::
                map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                ::operator[](__return_storage_ptr__,&local_4c);
      CKey::operator=(this_00,&key);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&key.keydata);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00974560;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<CKeyID, CKey> DescriptorScriptPubKeyMan::GetKeys() const
{
    AssertLockHeld(cs_desc_man);
    if (m_storage.HasEncryptionKeys() && !m_storage.IsLocked()) {
        KeyMap keys;
        for (const auto& key_pair : m_map_crypted_keys) {
            const CPubKey& pubkey = key_pair.second.first;
            const std::vector<unsigned char>& crypted_secret = key_pair.second.second;
            CKey key;
            m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
                return DecryptKey(encryption_key, crypted_secret, pubkey, key);
            });
            keys[pubkey.GetID()] = key;
        }
        return keys;
    }
    return m_map_keys;
}